

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O3

cio_error stream_read(cio_io_stream *stream,cio_read_buffer *buffer,
                     cio_io_stream_read_handler_t handler,void *handler_context)

{
  cio_error cVar1;
  
  if (((stream != (cio_io_stream *)0x0) && (buffer != (cio_read_buffer *)0x0)) &&
     (handler != (cio_io_stream_read_handler_t)0x0)) {
    stream[1].write_buffer = (cio_write_buffer *)stream;
    stream[1].read_handler_context = read_callback;
    stream->read_buffer = buffer;
    stream->read_handler = handler;
    stream->read_handler_context = handler_context;
    cVar1 = cio_linux_eventloop_register_read
                      ((cio_eventloop *)stream[2].write_handler,
                       (cio_event_notifier *)&stream[1].read_handler_context);
    return cVar1;
  }
  return CIO_INVALID_ARGUMENT;
}

Assistant:

static enum cio_error stream_read(struct cio_io_stream *stream, struct cio_read_buffer *buffer, cio_io_stream_read_handler_t handler, void *handler_context)
{
	if (cio_unlikely((stream == NULL) || (buffer == NULL) || (handler == NULL))) {
		return CIO_INVALID_ARGUMENT;
	}

	struct cio_socket *socket = cio_container_of(stream, struct cio_socket, stream);
	socket->impl.ev.context = stream;
	socket->impl.ev.read_callback = read_callback;
	socket->stream.read_buffer = buffer;
	socket->stream.read_handler = handler;
	socket->stream.read_handler_context = handler_context;

	return cio_linux_eventloop_register_read(socket->impl.loop, &socket->impl.ev);
}